

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O0

void __thiscall QHybrid::Compute(QHybrid *this)

{
  long *plVar1;
  long in_RDI;
  QHybrid *in_stack_000000b0;
  QHybrid *in_stack_00000120;
  
  if ((*(byte *)(in_RDI + 0x61) & 1) == 0) {
    Initialize(in_stack_000000b0);
  }
  if (*(long *)(in_RDI + 0x40) != 0) {
    plVar1 = *(long **)(in_RDI + 0x40);
    (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0x60)) + 0x10))
              ((long)plVar1 + *(long *)(*plVar1 + -0x60));
  }
  ComputeQ(in_stack_00000120);
  return;
}

Assistant:

void QHybrid::Compute()
{
    if(!_m_initialized)
        Initialize();

    // first compute the heuristic for the final time steps, as we
    // will use these values for the backup
    if(_m_QlastTimeSteps)
        _m_QlastTimeSteps->Compute();

    ComputeQ();
}